

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open_ssl_client.cpp
# Opt level: O0

void __thiscall
bidfx_public_api::tools::OpenSSLClient::OpenSSLClient
          (OpenSSLClient *this,string *host,int port,milliseconds read_timeout)

{
  bool bVar1;
  SSL_CTX *pSVar2;
  allocator<char> local_69;
  string local_68;
  shared_ptr<spdlog::logger> local_48 [2];
  int local_24;
  string *psStack_20;
  int port_local;
  string *host_local;
  OpenSSLClient *this_local;
  milliseconds read_timeout_local;
  
  local_24 = port;
  psStack_20 = host;
  host_local = (string *)this;
  this_local = (OpenSSLClient *)read_timeout.__r;
  Client::Client(&this->super_Client);
  (this->super_Client)._vptr_Client = (_func_int **)&PTR__OpenSSLClient_003a4d60;
  std::__cxx11::string::string((string *)&this->host_);
  OutputStreamImpl::OutputStreamImpl(&this->output_stream_,this);
  InputStreamImpl::InputStreamImpl(&this->input_stream_,this);
  bVar1 = std::operator==((shared_ptr<spdlog::logger> *)Log,(nullptr_t)0x0);
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_68,"OpenSSLClient",&local_69);
    LoggerFactory::GetLogger((LoggerFactory *)local_48,&local_68);
    std::shared_ptr<spdlog::logger>::operator=((shared_ptr<spdlog::logger> *)Log,local_48);
    std::shared_ptr<spdlog::logger>::~shared_ptr(local_48);
    std::__cxx11::string::~string((string *)&local_68);
    std::allocator<char>::~allocator(&local_69);
  }
  OPENSSL_init_ssl(0);
  std::__cxx11::string::operator=((string *)&this->host_,(string *)host);
  this->port_ = local_24;
  (this->read_timeout_).__r = (rep)this_local;
  pSVar2 = InitCTX(this);
  this->ctx_ = pSVar2;
  return;
}

Assistant:

OpenSSLClient::OpenSSLClient(std::string host, int port, std::chrono::milliseconds read_timeout) : output_stream_(OutputStreamImpl(*this)), input_stream_(InputStreamImpl(*this))
{
    if (Log == nullptr)
    {
        Log = LoggerFactory::GetLogger("OpenSSLClient");
    }
    SSL_library_init();
    host_ = std::move(host);
    port_ = port;
    read_timeout_ = read_timeout;
    ctx_ = InitCTX();
}